

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  pointer pBVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  size_t sVar7;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  pointer pvVar11;
  byte bVar12;
  undefined4 extraout_EAX;
  float *pfVar13;
  ulong uVar14;
  uint uVar15;
  BBoxRect *pBVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  ulong uVar20;
  uint uVar21;
  pointer pMVar22;
  float *pfVar23;
  float *pfVar24;
  int iVar25;
  float *pfVar26;
  long lVar27;
  float fVar28;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar29;
  float fVar31;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM1_Qb;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<int,_std::allocator<int>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  int local_1ec;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1e8;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_1c8;
  YoloDetectionOutput *local_1a8;
  float local_19c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_198;
  vector<float,_std::allocator<float>_> local_178;
  int local_160;
  Allocator *local_158;
  undefined4 local_150;
  int local_14c;
  int local_148;
  int local_144;
  ulong local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  vector<float,_std::allocator<float>_> local_128;
  int local_108;
  uint local_104;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Option *local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a8;
  ulong local_a0;
  pointer local_98;
  long local_90;
  ulong local_88;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar22 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_100 = bottom_top_blobs;
  local_f8 = opt;
  if ((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar22) {
    uVar17 = 0;
    local_1a8 = this;
    do {
      iVar25 = pMVar22[uVar17].c / this->num_box;
      if (iVar25 != this->num_class + 5) {
        iVar25 = -1;
        goto LAB_0016da63;
      }
      local_138 = *(float **)&pMVar22[uVar17].w;
      uStack_130 = 0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0 = uVar17;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize(&local_1c8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_1e8,(long)this->num_box);
      if (0 < this->num_box) {
        pMVar22 = pMVar22 + uVar17;
        auVar30._4_4_ = -(uint)(0 < (int)(float)local_138);
        auVar30._0_4_ = -(uint)(0 < (int)(float)local_138);
        auVar30._8_4_ = -(uint)(0 < local_138._4_4_);
        auVar30._12_4_ = -(uint)(0 < local_138._4_4_);
        local_104 = movmskpd(extraout_EAX,auVar30);
        bVar12 = (byte)local_104;
        auVar9._4_4_ = (float)local_138._4_4_;
        auVar9._0_4_ = (float)(int)(float)local_138;
        auVar9._8_4_ = (float)(int)uStack_130;
        auVar9._12_4_ = (float)uStack_130._4_4_;
        in_XMM1 = rcpps(in_XMM1,auVar9);
        local_78 = in_XMM1._0_4_;
        fStack_74 = in_XMM1._4_4_;
        fStack_70 = in_XMM1._8_4_;
        fStack_6c = in_XMM1._12_4_;
        local_78 = (1.0 - (float)(int)(float)local_138 * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_138._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (0.0 - (float)(int)uStack_130 * fStack_70) * fStack_70 + fStack_70;
        fStack_6c = (0.0 - (float)uStack_130._4_4_ * fStack_6c) * fStack_6c + fStack_6c;
        local_90 = (long)iVar25;
        local_88 = (ulong)local_138 & 0xffffffff;
        local_108 = local_138._4_4_;
        lVar27 = 0;
        local_98 = pMVar22;
        do {
          lVar18 = lVar27 * local_90;
          local_e8 = *(undefined8 *)((long)(this->biases).data + lVar27 * 8);
          uStack_e0 = 0;
          sVar7 = pMVar22->cstep;
          local_138 = (float *)pMVar22->data;
          pBVar16 = (BBoxRect *)pMVar22->elemsize;
          local_144 = this->num_class;
          local_14c = pMVar22->w;
          local_148 = pMVar22->h;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((lVar18 + 5) * sVar7 * (long)pBVar16 + (long)local_138);
          local_160 = pMVar22->elempack;
          local_158 = pMVar22->allocator;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_150 = 3;
          local_140 = ((long)(local_148 * local_14c) * (long)pBVar16 + 0xfU & 0xfffffffffffffff0) /
                      (ulong)pBVar16;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pBVar16;
          (*this->softmax->_vptr_Layer[9])(this->softmax,&local_178,local_f8);
          local_f0 = lVar27;
          if (bVar12 >> 1 != 0) {
            pfVar13 = (float *)(sVar7 * lVar18 * (long)pBVar16 + (long)local_138);
            pfVar24 = (float *)((lVar18 + 1) * sVar7 * (long)pBVar16 + (long)local_138);
            pfVar19 = (float *)((lVar18 + 2) * sVar7 * (long)pBVar16 + (long)local_138);
            pfVar26 = (float *)((lVar18 + 3) * sVar7 * (long)pBVar16 + (long)local_138);
            pfVar23 = (float *)((lVar18 + 4) * sVar7 * (long)pBVar16 + (long)local_138);
            local_e8 = CONCAT44(local_e8._4_4_ * 0.5,(float)local_e8 * 0.5);
            uStack_e0 = CONCAT44(uStack_e0._4_4_ * 0.0,(float)uStack_e0 * 0.0);
            local_1ec = 0;
            do {
              if ((local_104 & 1) != 0) {
                local_68 = ZEXT416((uint)(float)local_1ec);
                lVar27 = 0;
                uVar17 = 0;
                do {
                  local_138 = (float *)CONCAT44(local_138._4_4_,*pfVar19);
                  local_c8 = *pfVar26;
                  local_d8 = -*pfVar13;
                  fStack_d4 = -*pfVar24;
                  uStack_d0 = 0x80000000;
                  uStack_cc = 0x80000000;
                  local_80 = pfVar13;
                  local_48 = expf(local_d8);
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(fStack_d4);
                  fStack_54 = extraout_XMM0_Db_00;
                  local_d8 = expf(local_c8);
                  local_c8 = expf((float)local_138);
                  local_138 = pfVar23;
                  fVar28 = expf(-*pfVar23);
                  lVar18 = local_f0;
                  if ((long)local_1a8->num_class < 1) {
                    iVar25 = 0;
                    auVar30 = ZEXT816(0);
                  }
                  else {
                    pfVar13 = (float *)((long)local_1ec * (long)local_14c *
                                        (long)local_178.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        lVar27 + (long)local_178.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                    fVar32 = 0.0;
                    uVar20 = 0;
                    uVar14 = 0;
                    do {
                      fVar29 = *pfVar13;
                      bVar8 = fVar32 < fVar29;
                      if (fVar29 <= fVar32) {
                        fVar29 = fVar32;
                      }
                      fVar32 = fVar29;
                      auVar30 = ZEXT416((uint)fVar32);
                      if (bVar8) {
                        uVar14 = uVar20 & 0xffffffff;
                      }
                      iVar25 = (int)uVar14;
                      uVar20 = uVar20 + 1;
                      pfVar13 = (float *)((long)pfVar13 +
                                         (long)local_178.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage *
                                         local_140);
                    } while ((long)local_1a8->num_class != uVar20);
                  }
                  in_XMM1._4_12_ = auVar30._4_12_;
                  in_XMM1._0_4_ = auVar30._0_4_ / (fVar28 + 1.0);
                  local_19c = in_XMM1._0_4_;
                  if (local_1a8->confidence_threshold <= in_XMM1._0_4_) {
                    auVar35._0_4_ = local_48 + 1.0;
                    auVar35._4_4_ = local_58 + 1.0;
                    auVar35._8_4_ = fStack_44 + 0.0;
                    auVar35._12_4_ = fStack_54 + 0.0;
                    auVar30 = rcpps(in_XMM1,auVar35);
                    fVar28 = auVar30._0_4_;
                    fVar32 = auVar30._4_4_;
                    fVar28 = ((float)(int)uVar17 + fVar28 + (1.0 - auVar35._0_4_ * fVar28) * fVar28)
                             * local_78;
                    fVar32 = ((float)local_68._0_4_ + fVar32 +
                             (1.0 - auVar35._4_4_ * fVar32) * fVar32) * fStack_74;
                    fVar33 = local_c8 * (float)local_e8 * local_78;
                    fVar34 = local_d8 * local_e8._4_4_ * fStack_74;
                    fVar29 = fVar28 - fVar33;
                    fVar31 = fVar32 - fVar34;
                    fVar33 = fVar33 + fVar28;
                    fVar34 = fVar34 + fVar32;
                    in_XMM1 = CONCAT88(CONCAT44(fVar34,fVar33),CONCAT44(fVar31,fVar29));
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_f0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_b8 = in_XMM1;
                    local_a8 = iVar25;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_b8);
                    }
                    else {
                      (__position._M_current)->label = iVar25;
                      (__position._M_current)->xmin = fVar29;
                      (__position._M_current)->ymin = fVar31;
                      (__position._M_current)->xmax = fVar33;
                      (__position._M_current)->ymax = fVar34;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_1e8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar18);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_19c);
                    }
                    else {
                      *__position_00._M_current = local_19c;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar13 = local_80 + 1;
                  pfVar24 = pfVar24 + 1;
                  pfVar19 = pfVar19 + 1;
                  pfVar26 = pfVar26 + 1;
                  pfVar23 = local_138 + 1;
                  uVar17 = uVar17 + 1;
                  lVar27 = lVar27 + 4;
                } while (uVar17 != local_88);
              }
              local_1ec = local_1ec + 1;
            } while (local_1ec != local_108);
          }
          pMVar22 = local_98;
          lVar27 = local_f0;
          this = local_1a8;
          if ((BBoxRect *)
              local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != (BBoxRect *)0x0) {
            LOCK();
            *local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (float)((int)*local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
            UNLOCK();
            if (*local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish == 0.0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (float *)0x0) {
                  free(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
                }
              }
              else {
                (**(code **)(*(long *)local_158 + 0x18))();
                in_XMM1._8_8_ = extraout_XMM1_Qb;
                in_XMM1._0_8_ = extraout_XMM1_Qa;
              }
            }
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < this->num_box);
        if (0 < this->num_box) {
          lVar27 = 8;
          lVar18 = 0;
          do {
            pvVar11 = local_1e8.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                      ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                       local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar27 + -8),
                       *(undefined8 *)
                        ((long)&((local_1c8.
                                  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)
                                ._M_impl.super__Vector_impl_data._M_start + lVar27));
            std::vector<float,std::allocator<float>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                      ((vector<float,std::allocator<float>> *)&local_128,
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)((long)pvVar11 + lVar27 + -8),
                       *(undefined8 *)
                        ((long)&(pvVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                .super__Vector_impl_data._M_start + lVar27));
            lVar18 = lVar18 + 1;
            lVar27 = lVar27 + 0x18;
          } while (lVar18 < this->num_box);
        }
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1e8);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      uVar17 = local_a0 + 1;
      pMVar22 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(local_100->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22 >> 6))
    ;
    if ((local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&local_198,&local_128,0,
                 (int)((ulong)((long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = (YoloDetectionOutput *)CONCAT44(local_1a8._4_4_,this->nms_threshold);
  uVar21 = (int)((long)local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x33333333;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_178,(long)(int)uVar21,(allocator_type *)&local_1e8);
  if (0 < (int)uVar21) {
    pfVar13 = &(local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    uVar17 = 0;
    do {
      uVar4 = ((BBoxRect *)(pfVar13 + -2))->xmin;
      uVar5 = ((BBoxRect *)(pfVar13 + -2))->ymin;
      local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] =
           ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) - (float)uVar5) *
           ((float)*(undefined8 *)pfVar13 - (float)uVar4);
      uVar17 = uVar17 + 1;
      pfVar13 = pfVar13 + 5;
    } while ((uVar21 & 0x7fffffff) != uVar17);
    local_1e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar25 = 0;
    do {
      uVar15 = (uint)((ulong)((long)local_1c8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1c8.
                                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2);
      if ((int)uVar15 < 1) {
LAB_0016d7d3:
        if (local_1c8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1c8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1c8,
                     (iterator)
                     local_1c8.
                     super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(int *)&local_1e8);
        }
        else {
          *(int *)local_1c8.
                  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar25;
          local_1c8.
          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
      }
      else {
        pBVar1 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar25;
        fVar28 = pBVar1->xmin;
        bVar8 = true;
        uVar17 = 0;
        do {
          iVar6 = *(int *)((long)&((local_1c8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17 * 4);
          fVar32 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar6].xmax;
          fVar29 = 0.0;
          if (fVar28 <= fVar32) {
            pBVar2 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start + iVar6;
            fVar31 = pBVar1->xmax;
            fVar33 = pBVar2->xmin;
            if (fVar33 <= fVar31) {
              fVar34 = pBVar1->ymin;
              fVar36 = pBVar2->ymax;
              if (fVar34 <= fVar36) {
                fVar3 = pBVar1->ymax;
                fVar37 = pBVar2->ymin;
                if (fVar37 <= fVar3) {
                  if (fVar31 <= fVar32) {
                    fVar32 = fVar31;
                  }
                  if (fVar33 <= fVar28) {
                    fVar33 = fVar28;
                  }
                  if (fVar3 <= fVar36) {
                    fVar36 = fVar3;
                  }
                  if (fVar37 <= fVar34) {
                    fVar37 = fVar34;
                  }
                  fVar29 = (fVar36 - fVar37) * (fVar32 - fVar33);
                }
              }
            }
          }
          if (local_1a8._0_4_ <
              fVar29 / ((local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar25] - fVar29) +
                       local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar6])) {
            bVar8 = false;
          }
          uVar17 = uVar17 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar17);
        if (bVar8) goto LAB_0016d7d3;
      }
      iVar25 = (int)local_1e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_1e8.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar25);
    } while (iVar25 < (int)uVar21);
  }
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar25 = 0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (int)((ulong)((long)local_1c8.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8.
                             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
    lVar27 = 0;
    do {
      iVar25 = *(int *)((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar27 * 4);
      pBVar16 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start + iVar25;
      if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_178,
                   (iterator)
                   local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,pBVar16);
      }
      else {
        *(int *)((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x10) = pBVar16->label;
        fVar28 = pBVar16->ymin;
        uVar10 = *(undefined8 *)&pBVar16->xmax;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[0] = pBVar16->xmin;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[1] = fVar28;
        *(undefined8 *)
         ((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = uVar10;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_178.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar25);
      }
      else {
        *(float *)local_1e8.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[iVar25];
        local_1e8.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1e8.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (int)((ulong)((long)local_1c8.
                                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1c8.
                                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
    uVar21 = (int)((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar25 = 0;
    if (uVar21 != 0) {
      this_02 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar21,4,local_f8->blob_allocator);
      iVar25 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar25 = 0, 0 < (int)uVar21)) {
        iVar6 = this_02->w;
        sVar7 = this_02->elemsize;
        pfVar13 = (float *)((long)this_02->data + 0x14);
        pfVar19 = local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        iVar25 = 0;
        uVar17 = 0;
        do {
          fVar28 = *(float *)((long)&((local_1e8.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_start + uVar17 * 4);
          pfVar13[-5] = (float)(int)((int)*pfVar19 + 1);
          pfVar13[-4] = fVar28;
          pfVar13[-3] = pfVar19[-4];
          pfVar13[-2] = pfVar19[-3];
          pfVar13[-1] = pfVar19[-2];
          *pfVar13 = pfVar19[-1];
          uVar17 = uVar17 + 1;
          pfVar13 = (float *)((long)pfVar13 + (long)iVar6 * sVar7);
          pfVar19 = pfVar19 + 5;
        } while ((uVar21 & 0x7fffffff) != uVar17);
      }
    }
  }
  if (local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0016da63:
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar25;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = exp(wptr[0]) * bias_w / w;
                    float bbox_h = exp(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<int> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 0; i < (int)picked.size(); i++)
    {
        int z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1;// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}